

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.h
# Opt level: O0

void __thiscall GrcMasterValueList::~GrcMasterValueList(GrcMasterValueList *this)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_> *in_RDI;
  iterator it;
  GdlAssignment *in_stack_ffffffffffffffd8;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
       ::begin((map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
                *)in_stack_ffffffffffffffd8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
         ::end((map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
                *)in_stack_ffffffffffffffd8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>::
             operator->(in_RDI);
    in_stack_ffffffffffffffd8 = ppVar2->second;
    if (in_stack_ffffffffffffffd8 != (GdlAssignment *)0x0) {
      (*(in_stack_ffffffffffffffd8->super_GrcAssignment)._vptr_GrcAssignment[1])();
    }
    std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>::operator++
              (in_RDI);
  }
  std::
  map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
  ::~map((map<GrcSymbolTableEntry_*,_GdlAssignment_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GdlAssignment_*>_>_>
          *)0x1b8d6b);
  return;
}

Assistant:

~GrcMasterValueList()
	{
		//	Once the list has been processed, the assignment items might be deleted
		//	as part of the class definition, or whatever, so don't do it here.
		for (ValueMap::iterator it = m_valmapEntries.begin();
			it != m_valmapEntries.end();
			++it)
		{
			delete it->second; // GetValue();
		}
	}